

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status
parse_sub_delims(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  int iVar1;
  char *pcVar2;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  pcVar2 = read_char(uri,len,offset);
  iVar1 = (int)*pcVar2;
  if ((((iVar1 == 0x21) || (iVar1 == 0x24)) || (iVar1 - 0x26U < 7)) ||
     ((iVar1 == 0x3b || (iVar1 == 0x3d)))) {
    uri_local._4_4_ = curi_status_success;
  }
  else {
    uri_local._4_4_ = curi_status_error;
  }
  return uri_local._4_4_;
}

Assistant:

static curi_status parse_sub_delims(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    //sub-delims    = "!" / "$" / "&" / "'" / "(" / ")"
    //             / "*" / "+" / "," / ";" / "="
    switch (*read_char(uri,len,offset))
    {
        CASE_SUB_DELIMS:
            return curi_status_success;
        default:
            return curi_status_error;
    }
}